

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pm_column_tests.h
# Opt level: O0

void column_test_common_content_access<Gudhi::persistence_matrix::List_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)0,true,false,false>>>,unsigned_int>
               (List_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_true,_false,_false>_>_>
                *col,set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                     *setcont,vector<bool,_std::allocator<bool>_> *veccont)

{
  undefined8 uVar1;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *this;
  bool bVar2;
  const_reference cVar3;
  lazy_ostream *plVar4;
  size_type sVar5;
  ulong uVar6;
  basic_cstring<const_char> local_3c8;
  basic_cstring<const_char> local_3b8;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_3a8;
  assertion_result local_388;
  basic_cstring<const_char> local_370;
  basic_cstring<const_char> local_360;
  basic_cstring<const_char> local_350;
  basic_cstring<const_char> local_340;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_330;
  assertion_result local_310;
  basic_cstring<const_char> local_2f8;
  basic_cstring<const_char> local_2e8;
  uint local_2d4;
  undefined1 local_2d0 [4];
  uint i;
  basic_cstring<const_char> local_2c0;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_2b0;
  assertion_result local_290;
  basic_cstring<const_char> local_278;
  basic_cstring<const_char> local_268;
  basic_cstring<const_char> local_258;
  basic_cstring<const_char> local_248;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_238;
  assertion_result local_218;
  basic_cstring<const_char> local_200;
  basic_cstring<const_char> local_1f0;
  size_type local_1e0;
  size_t local_1d8;
  basic_cstring<const_char> local_1d0;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_1c0;
  basic_cstring<const_char> local_198;
  basic_cstring<const_char> local_188;
  basic_cstring<const_char> local_178;
  basic_cstring<const_char> local_168;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_158;
  vector<bool,_std::allocator<bool>_> local_138;
  assertion_result local_110;
  basic_cstring<const_char> local_f8;
  basic_cstring<const_char> local_e8;
  basic_cstring<const_char> local_d8;
  basic_cstring<const_char> local_c8;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_b8;
  column_content<Gudhi::persistence_matrix::List_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_true,_false,_false>_>_>_>
  local_88;
  assertion_result local_58;
  basic_cstring<const_char> local_40;
  basic_cstring<const_char> local_30;
  vector<bool,_std::allocator<bool>_> *local_20;
  vector<bool,_std::allocator<bool>_> *veccont_local;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *setcont_local;
  List_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_true,_false,_false>_>_>
  *col_local;
  
  local_20 = veccont;
  veccont_local = (vector<bool,_std::allocator<bool>_> *)setcont;
  setcont_local = (set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)col;
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_30,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_40);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_30,0x11d,&local_40);
    get_column_content_via_iterators<Gudhi::persistence_matrix::List_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)0,true,false,false>>>>
              (&local_88,
               (List_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_true,_false,_false>_>_>
                *)setcont_local);
    bVar2 = std::operator==(&local_88,
                            (set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                             *)veccont_local);
    boost::test_tools::assertion_result::assertion_result(&local_58,bVar2);
    plVar4 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_c8,"get_column_content_via_iterators(col) == setcont",0x30);
    boost::unit_test::operator<<(&local_b8,plVar4,&local_c8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_d8,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::test_tools::tt_detail::report_assertion(&local_58,&local_b8,&local_d8,0x11d,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_b8);
    boost::test_tools::assertion_result::~assertion_result(&local_58);
    std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::~set(&local_88);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_e8,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_f8);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_e8,0x11e,&local_f8);
    this = setcont_local;
    sVar5 = std::vector<bool,_std::allocator<bool>_>::size(local_20);
    Gudhi::persistence_matrix::
    List_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_true,_false,_false>_>_>
    ::get_content(&local_138,
                  (List_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_true,_false,_false>_>_>
                   *)this,(int)sVar5);
    bVar2 = std::operator==(&local_138,local_20);
    boost::test_tools::assertion_result::assertion_result(&local_110,bVar2);
    plVar4 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_168,"col.get_content(veccont.size()) == veccont",0x2a);
    boost::unit_test::operator<<(&local_158,plVar4,&local_168);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_178,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::test_tools::tt_detail::report_assertion(&local_110,&local_158,&local_178,0x11e,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_158);
    boost::test_tools::assertion_result::~assertion_result(&local_110);
    std::vector<bool,_std::allocator<bool>_>::~vector(&local_138);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_188,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_198);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_188,0x120,&local_198);
    plVar4 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_1c0,plVar4,(char (*) [1])0x29616e);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1d0,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    local_1d8 = Gudhi::persistence_matrix::
                List_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_true,_false,_false>_>_>
                ::size((List_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_true,_false,_false>_>_>
                        *)setcont_local);
    local_1e0 = std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::size
                          ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                            *)veccont_local);
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long>
              (&local_1c0,&local_1d0,0x120,1,2,&local_1d8,"col.size()",&local_1e0,"setcont.size()");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_1c0);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  bVar2 = std::vector<bool,_std::allocator<bool>_>::empty(local_20);
  if (bVar2) {
    do {
      uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                (&local_1f0,
                 "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
                 ,0x73);
      boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_200);
      boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_1f0,0x124,&local_200);
      bVar2 = Gudhi::persistence_matrix::
              List_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_true,_false,_false>_>_>
              ::is_empty((List_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_true,_false,_false>_>_>
                          *)setcont_local);
      boost::test_tools::assertion_result::assertion_result(&local_218,bVar2);
      plVar4 = boost::unit_test::lazy_ostream::instance();
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                (&local_248,"col.is_empty()",0xe);
      boost::unit_test::operator<<(&local_238,plVar4,&local_248);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                (&local_258,
                 "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
                 ,0x73);
      boost::test_tools::tt_detail::report_assertion(&local_218,&local_238,&local_258,0x124,1,0,0);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
      ::~lazy_ostream_impl(&local_238);
      boost::test_tools::assertion_result::~assertion_result(&local_218);
      bVar2 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar2);
  }
  else {
    do {
      uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                (&local_268,
                 "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
                 ,0x73);
      boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_278);
      boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_268,0x126,&local_278);
      bVar2 = Gudhi::persistence_matrix::
              List_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_true,_false,_false>_>_>
              ::is_empty((List_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_true,_false,_false>_>_>
                          *)setcont_local);
      boost::test_tools::assertion_result::assertion_result(&local_290,!bVar2);
      plVar4 = boost::unit_test::lazy_ostream::instance();
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                (&local_2c0,"!col.is_empty()",0xf);
      boost::unit_test::operator<<(&local_2b0,plVar4,&local_2c0);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)local_2d0,
                 "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
                 ,0x73);
      boost::test_tools::tt_detail::report_assertion(&local_290,&local_2b0,local_2d0,0x126,1,0,0);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
      ::~lazy_ostream_impl(&local_2b0);
      boost::test_tools::assertion_result::~assertion_result(&local_290);
      bVar2 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar2);
  }
  for (local_2d4 = 0; uVar6 = (ulong)local_2d4,
      sVar5 = std::vector<bool,_std::allocator<bool>_>::size(local_20), uVar6 < sVar5;
      local_2d4 = local_2d4 + 1) {
    cVar3 = std::vector<bool,_std::allocator<bool>_>::operator[](local_20,(ulong)local_2d4);
    if (cVar3) {
      do {
        uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  (&local_360,
                   "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
                   ,0x73);
        boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_370);
        boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_360,300,&local_370);
        bVar2 = Gudhi::persistence_matrix::
                List_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_true,_false,_false>_>_>
                ::is_non_zero((List_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_true,_false,_false>_>_>
                               *)setcont_local,local_2d4);
        boost::test_tools::assertion_result::assertion_result(&local_388,bVar2);
        plVar4 = boost::unit_test::lazy_ostream::instance();
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  (&local_3b8,"col.is_non_zero(i)",0x12);
        boost::unit_test::operator<<(&local_3a8,plVar4,&local_3b8);
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  (&local_3c8,
                   "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
                   ,0x73);
        boost::test_tools::tt_detail::report_assertion(&local_388,&local_3a8,&local_3c8,300,1,0,0);
        boost::unit_test::
        lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
        ::~lazy_ostream_impl(&local_3a8);
        boost::test_tools::assertion_result::~assertion_result(&local_388);
        bVar2 = boost::test_tools::tt_detail::dummy_cond();
      } while (bVar2);
    }
    else {
      do {
        uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  (&local_2e8,
                   "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
                   ,0x73);
        boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_2f8);
        boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_2e8,0x12a,&local_2f8);
        bVar2 = Gudhi::persistence_matrix::
                List_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_true,_false,_false>_>_>
                ::is_non_zero((List_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_true,_false,_false>_>_>
                               *)setcont_local,local_2d4);
        boost::test_tools::assertion_result::assertion_result(&local_310,!bVar2);
        plVar4 = boost::unit_test::lazy_ostream::instance();
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  (&local_340,"!col.is_non_zero(i)",0x13);
        boost::unit_test::operator<<(&local_330,plVar4,&local_340);
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  (&local_350,
                   "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
                   ,0x73);
        boost::test_tools::tt_detail::report_assertion(&local_310,&local_330,&local_350,0x12a,1,0,0)
        ;
        boost::unit_test::
        lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
        ::~lazy_ostream_impl(&local_330);
        boost::test_tools::assertion_result::~assertion_result(&local_310);
        bVar2 = boost::test_tools::tt_detail::dummy_cond();
      } while (bVar2);
    }
  }
  return;
}

Assistant:

void column_test_common_content_access(Column& col,
                                       const std::set<entry_type>& setcont,
                                       const std::vector<typename Column::Field_element>& veccont) {
  BOOST_CHECK(get_column_content_via_iterators(col) == setcont);
  BOOST_CHECK(col.get_content(veccont.size()) == veccont);
  if constexpr (Column::Master::Option_list::column_type != Column_types::HEAP) {
    BOOST_CHECK_EQUAL(col.size(), setcont.size());
  }

  if (veccont.empty())
    BOOST_CHECK(col.is_empty());
  else
    BOOST_CHECK(!col.is_empty());

  for (unsigned int i = 0; i < veccont.size(); ++i) {
    if (veccont[i] == 0u)
      BOOST_CHECK(!col.is_non_zero(i));
    else
      BOOST_CHECK(col.is_non_zero(i));
  }
}